

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O1

void __thiscall helics::tcp::TcpComms::~TcpComms(TcpComms *this)

{
  ~TcpComms(this);
  operator_delete(this,0x5a0);
  return;
}

Assistant:

TcpComms::~TcpComms()
{
    disconnect();
}